

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

uint auth_method_from_name(char *name)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  iVar2 = strcmp(name,"none");
  if (iVar2 == 0) {
    uVar3 = 1;
  }
  else {
    iVar2 = strcmp(name,"tis");
    if (iVar2 == 0) {
      uVar3 = 0x10;
    }
    else {
      iVar2 = strcmp(name,"cryptocard");
      uVar3 = 0x20;
      if ((iVar2 != 0) && (iVar2 = strcmp(name,"ccard"), iVar2 != 0)) {
        iVar2 = strcmp(name,"keyboard-interactive");
        uVar3 = 8;
        if (((iVar2 != 0) &&
            ((iVar2 = strcmp(name,"k-i"), iVar2 != 0 && (iVar2 = strcmp(name,"kbdint"), iVar2 != 0))
            )) && ((cVar1 = *name, cVar1 != 'k' || ((name[1] != 'i' || (name[2] != '\0')))))) {
          iVar2 = strcmp(name,"publickey");
          uVar3 = 4;
          if ((iVar2 != 0) && (iVar2 = strcmp(name,"pubkey"), iVar2 != 0)) {
            if (cVar1 == 'p') {
              if ((name[1] == 'k') && (name[2] == '\0')) {
                return 4;
              }
              iVar2 = strcmp(name,"password");
              if (iVar2 == 0) {
                return 2;
              }
              if (name[1] != 'w') {
                return 0;
              }
              bVar4 = name[2] == '\0';
            }
            else {
              iVar2 = strcmp(name,"password");
              bVar4 = iVar2 == 0;
            }
            uVar3 = (uint)bVar4 * 2;
          }
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static unsigned auth_method_from_name(const char *name)
{
    if (!strcmp(name, "none"))
        return AUTHMETHOD_NONE;
    if (!strcmp(name, "tis"))
        return AUTHMETHOD_TIS;
    if (!strcmp(name, "cryptocard") || !strcmp(name, "ccard"))
        return AUTHMETHOD_CRYPTOCARD;
    if (!strcmp(name, "keyboard-interactive") || !strcmp(name, "k-i") ||
        !strcmp(name, "kbdint")  || !strcmp(name, "ki"))
        return AUTHMETHOD_KBDINT;
    if (!strcmp(name, "publickey") || !strcmp(name, "pubkey") ||
        !strcmp(name, "pk"))
        return AUTHMETHOD_PUBLICKEY;
    if (!strcmp(name, "password") || !strcmp(name, "pw"))
        return AUTHMETHOD_PASSWORD;
    return 0;
}